

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O0

void trial::protocol::serialization::
     load_overloader<trial::protocol::bintoken::iarchive,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
     ::load(iarchive *ar,vector<unsigned_char,_std::allocator<unsigned_char>_> *data,uint param_3)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar1;
  value vVar2;
  size_type __n;
  uchar *data_00;
  size_type size;
  error *this;
  value_type_conflict2 local_1d;
  uint local_1c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvStack_18;
  uint param_2_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data_local;
  iarchive *ar_local;
  
  local_1c = param_3;
  pvStack_18 = data;
  data_local = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)ar;
  vVar2 = bintoken::iarchive::code(ar);
  pvVar1 = pvStack_18;
  if ((((vVar2 != array8_int8) && (vVar2 != array16_int8)) && (vVar2 != array32_int8)) &&
     (vVar2 != array64_int8)) {
    this = (error *)__cxa_allocate_exception(0x20);
    bintoken::error::error(this,incompatible_type);
    __cxa_throw(this,&bintoken::error::typeinfo,bintoken::error::~error);
  }
  __n = bintoken::iarchive::length((iarchive *)data_local);
  local_1d = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::assign(pvVar1,__n,&local_1d);
  pvVar1 = data_local;
  data_00 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(pvStack_18);
  size = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pvStack_18);
  bintoken::iarchive::load_array<unsigned_char>((iarchive *)pvVar1,data_00,size);
  return;
}

Assistant:

static void load(bintoken::iarchive& ar,
                     std::vector<std::uint8_t, Allocator>& data,
                     const unsigned int /* protocol_version */)
    {
        switch (ar.code())
        {
        case bintoken::token::code::array8_int8:
        case bintoken::token::code::array16_int8:
        case bintoken::token::code::array32_int8:
        case bintoken::token::code::array64_int8:
            data.assign(ar.length(), {});
            ar.load_array(data.data(), data.size());
            break;

        default:
            throw bintoken::error(bintoken::incompatible_type);
        }
    }